

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_static_analyzer.cpp
# Opt level: O3

int process_single_source
              (string *file_name,string *source_code,string *sqconfig_file_name,bool use_csq,
              bool collect_ident_tree)

{
  undefined8 *puVar1;
  _Rb_tree_header *p_Var2;
  char cVar3;
  char *pcVar4;
  pointer pcVar5;
  bool bVar6;
  uint uVar7;
  bool bVar8;
  bool bVar9;
  int iVar10;
  int iVar11;
  Node *node;
  undefined8 *puVar12;
  long *plVar13;
  uint uVar14;
  size_type *psVar15;
  string *psVar16;
  long *plVar17;
  _Base_ptr *pp_Var18;
  ulong uVar19;
  byte bVar20;
  uint uVar21;
  uint uVar22;
  int iVar23;
  uint __len;
  char *__s1;
  char *local_498;
  char *local_490;
  string sqconfigFileName;
  undefined8 *local_440;
  undefined8 local_438;
  undefined8 local_430;
  undefined8 uStack_428;
  long *local_420;
  long local_418;
  long local_410;
  long lStack_408;
  ulong *local_400;
  long local_3f8;
  ulong local_3f0 [2];
  ulong *local_3e0;
  long local_3d8;
  ulong local_3d0 [2];
  long *local_3c0;
  long local_3b8;
  long local_3b0;
  long lStack_3a8;
  Lexer lex;
  CompilationContext ctx;
  ifstream tmp;
  undefined4 uStack_234;
  _Base_ptr local_228;
  _Base_ptr p_Stack_220;
  byte abStack_218 [200];
  undefined8 auStack_150 [36];
  
  CompilationContext::CompilationContext(&ctx);
  _tmp = (_Base_ptr *)CONCAT44(uStack_234,1);
  if (argc__ < 2) {
    bVar6 = false;
    local_498 = "";
    local_490 = "";
    bVar9 = false;
  }
  else {
    iVar23 = 1;
    bVar8 = false;
    local_498 = "";
    local_490 = "";
    bVar6 = false;
    bVar9 = false;
    iVar11 = argc__;
    do {
      pcVar4 = argv__[iVar23];
      iVar10 = strcmp("-duplucate-if-expression",pcVar4);
      __s1 = "-duplicate-if-expression";
      if (iVar10 != 0) {
        __s1 = pcVar4;
      }
      iVar10 = strncmp(__s1,"--tokens-output-file:",0x15);
      if (iVar10 == 0) {
        local_490 = __s1 + 0x15;
        bVar9 = true;
LAB_00118e43:
        std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
        _M_insert_unique<int_const&>
                  ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                   &used_args,(int *)&tmp);
        iVar11 = argc__;
        iVar23 = _tmp;
      }
      else {
        iVar10 = strncmp(__s1,"--ast-output-file:",0x12);
        if (iVar10 == 0) {
          local_498 = __s1 + 0x12;
          bVar6 = true;
          goto LAB_00118e43;
        }
        iVar10 = strcmp(__s1,"--inverse-warnings");
        if (iVar10 == 0) {
          bVar8 = true;
          goto LAB_00118e43;
        }
        iVar10 = strncmp(__s1,"--csq-exe:",10);
        pcVar4 = DAT_0013c3b8;
        if (iVar10 == 0) {
          strlen(__s1 + 10);
          std::__cxx11::string::_M_replace(0x13c3b0,0,pcVar4,(ulong)(__s1 + 10));
          goto LAB_00118e43;
        }
        iVar10 = strncmp(__s1,"--output-mode:",0xe);
        if (iVar10 == 0) {
          ctx.outputMode = str_to_output_mode(__s1 + 0xe);
          goto LAB_00118e43;
        }
        if (*__s1 == '-') {
          cVar3 = __s1[1];
          iVar10 = toupper((int)cVar3);
          if ((iVar10 == 0x57) && ((int)__s1[2] - 0x30U < 10)) {
            iVar11 = atoi(__s1 + 2);
            CompilationContext::suppressWaring(&ctx,iVar11);
          }
          else {
            iVar10 = isalpha((int)cVar3);
            if (iVar10 == 0) goto LAB_00118e66;
            CompilationContext::suppressWaring(&ctx,__s1 + 1);
          }
          goto LAB_00118e43;
        }
      }
LAB_00118e66:
      iVar23 = iVar23 + 1;
      _tmp = (_Base_ptr *)CONCAT44(uStack_234,iVar23);
    } while (iVar23 < iVar11);
    if (bVar8) {
      CompilationContext::inverseWarningsSuppression(&ctx);
    }
  }
  bVar8 = CompilationContext::isWarningSuppressed(&ctx,"undefined-variable");
  if ((bVar8) && (bVar8 = CompilationContext::isWarningSuppressed(&ctx,"never-declared"), bVar8)) {
    variable_presense_check = false;
  }
  else {
    variable_presense_check = (bool)(~collect_ident_tree & use_csq);
  }
  if (file_name->_M_string_length == 0) {
    uVar21 = 1;
    CompilationContext::globalError("Expected file name");
    goto LAB_001197e3;
  }
  if (source_code->_M_string_length == 0) {
    std::ifstream::ifstream(&tmp,(string *)file_name,_S_in);
    if ((abStack_218[(long)_tmp[-3]] & 5) != 0) {
      local_420 = &local_410;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_420,"Cannot open file \'","")
      ;
      plVar13 = (long *)std::__cxx11::string::append((char *)&local_420);
      psVar15 = (size_type *)(plVar13 + 2);
      if ((size_type *)*plVar13 == psVar15) {
        sqconfigFileName.field_2._M_allocated_capacity = *psVar15;
        sqconfigFileName.field_2._8_8_ = plVar13[3];
        sqconfigFileName._M_dataplus._M_p = (pointer)&sqconfigFileName.field_2;
      }
      else {
        sqconfigFileName.field_2._M_allocated_capacity = *psVar15;
        sqconfigFileName._M_dataplus._M_p = (pointer)*plVar13;
      }
      sqconfigFileName._M_string_length = plVar13[1];
      *plVar13 = (long)psVar15;
      plVar13[1] = 0;
      *(undefined1 *)(plVar13 + 2) = 0;
      plVar13 = (long *)std::__cxx11::string::append((char *)&sqconfigFileName);
      p_Var2 = &lex.tokenIdentStringToType._M_t._M_impl.super__Rb_tree_header;
      psVar16 = (string *)(plVar13 + 2);
      if ((string *)*plVar13 == psVar16) {
        lex.tokenIdentStringToType._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
             (psVar16->_M_dataplus)._M_p;
        lex.tokenIdentStringToType._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)plVar13[3];
        lex.s = (string *)p_Var2;
      }
      else {
        lex.tokenIdentStringToType._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
             (psVar16->_M_dataplus)._M_p;
        lex.s = (string *)*plVar13;
      }
      lex.tokenIdentStringToType._M_t._M_impl._0_8_ = plVar13[1];
      *plVar13 = (long)psVar16;
      plVar13[1] = 0;
      *(undefined1 *)(plVar13 + 2) = 0;
      CompilationContext::globalError((char *)lex.s);
      if ((_Rb_tree_header *)lex.s != p_Var2) {
        operator_delete(lex.s);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)sqconfigFileName._M_dataplus._M_p != &sqconfigFileName.field_2) {
        operator_delete(sqconfigFileName._M_dataplus._M_p);
      }
      if (local_420 != &local_410) {
        operator_delete(local_420);
      }
      std::ifstream::~ifstream(&tmp);
      uVar21 = 1;
      goto LAB_001197e3;
    }
    p_Var2 = &lex.tokenIdentStringToType._M_t._M_impl.super__Rb_tree_header;
    lex.s = (string *)p_Var2;
    std::__cxx11::string::_M_construct<std::istreambuf_iterator<char,std::char_traits<char>>>
              ((string *)&lex,*(undefined8 *)((long)auStack_150 + (long)_tmp[-3]),0xffffffff);
    std::__cxx11::string::operator=((string *)&ctx.code,(string *)&lex);
    if ((_Rb_tree_header *)lex.s != p_Var2) {
      operator_delete(lex.s);
    }
    std::ifstream::~ifstream(&tmp);
  }
  else {
    std::__cxx11::string::_M_assign((string *)&ctx.code);
  }
  CompilationContext::setFileName(&ctx,file_name);
  if (sqconfig_file_name->_M_string_length == 0) {
    settings::search_sqconfig_abi_cxx11_
              (&sqconfigFileName,(settings *)(file_name->_M_dataplus)._M_p,(char *)0x0);
  }
  else {
    sqconfigFileName._M_dataplus._M_p = (pointer)&sqconfigFileName.field_2;
    pcVar5 = (sqconfig_file_name->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&sqconfigFileName,pcVar5,pcVar5 + sqconfig_file_name->_M_string_length);
  }
  if ((sqconfigFileName._M_string_length == DAT_0013c488) &&
     ((sqconfigFileName._M_string_length == 0 ||
      (iVar11 = bcmp(sqconfigFileName._M_dataplus._M_p,settings::cur_config_file_name_abi_cxx11_,
                     sqconfigFileName._M_string_length), iVar11 == 0)))) {
    uVar21 = 1;
    if (settings::cur_config_file_failed == '\0') goto LAB_0011908e;
  }
  else {
    settings::reset();
    if (sqconfigFileName._M_string_length != 0) {
      bVar8 = settings::append_from_file(sqconfigFileName._M_dataplus._M_p);
      uVar21 = 1;
      if (!bVar8) goto LAB_001197d0;
    }
LAB_0011908e:
    if (variable_presense_check == true) {
      moduleexports::module_export_collector(&ctx,0,0,(char *)0x0);
    }
    iVar11 = strncmp(ctx.code._M_dataplus._M_p,"//expect:error",0xe);
    iVar23 = strncmp(ctx.code._M_dataplus._M_p,"//expect:w",10);
    uVar22 = 0;
    if (iVar23 == 0) {
      uVar22 = atoi(ctx.code._M_dataplus._M_p + 10);
    }
    if (uVar22 != 0 || iVar11 == 0) {
      CompilationContext::clearSuppressedWarnings(&ctx);
    }
    if (bVar9) {
      if (CompilationContext::redirectMessagesToJson == (char *)0x0) {
LAB_00119137:
        CompilationContext::clearSuppressedWarnings(&ctx);
        CompilationContext::inverseWarningsSuppression(&ctx);
      }
    }
    else if ((bool)(bVar6 & CompilationContext::redirectMessagesToJson == (char *)0x0))
    goto LAB_00119137;
    bVar8 = process_import(&ctx);
    uVar21 = 1;
    if (bVar8) {
      Lexer::Lexer(&lex,&ctx);
      bVar8 = Lexer::process(&lex);
      if (bVar9) {
        bVar9 = tokens_to_json(local_490,&lex);
        if (bVar8 && bVar9) goto LAB_00119221;
LAB_001191b0:
        bVar9 = false;
LAB_001193f3:
        if (ctx.isError == false) {
          if (iVar11 == 0) {
            uVar21 = 1;
            CompilationContext::globalError("Expected error.");
            goto LAB_001197b1;
          }
          bVar20 = bVar9 & (ctx.isWarning ^ 1U);
        }
        else {
          bVar20 = 0;
        }
        if ((uVar22 == 0) ||
           (((ctx.isWarning == true &&
             ((long)ctx.shownWarningsAndErrors.super__Vector_base<int,_std::allocator<int>_>._M_impl
                    .super__Vector_impl_data._M_finish -
              (long)ctx.shownWarningsAndErrors.super__Vector_base<int,_std::allocator<int>_>._M_impl
                    .super__Vector_impl_data._M_start == 4)) &&
            (*ctx.shownWarningsAndErrors.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start == uVar22)))) {
          if (uVar22 == 0 && iVar11 != 0) {
            uVar21 = (uint)(bVar20 ^ 1);
          }
          else {
            iVar11 = CompilationContext::getErrorLevel();
            uVar21 = 0;
            if (iVar11 != 4) {
              CompilationContext::clearErrorLevel();
              uVar21 = 0;
            }
          }
        }
        else {
          local_3e0 = local_3d0;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_3e0,"Expected only one warning \'w","");
          uVar21 = -uVar22;
          if (0 < (int)uVar22) {
            uVar21 = uVar22;
          }
          __len = 1;
          if (9 < uVar21) {
            uVar19 = (ulong)uVar21;
            uVar7 = 4;
            do {
              __len = uVar7;
              uVar14 = (uint)uVar19;
              if (uVar14 < 100) {
                __len = __len - 2;
                goto LAB_0011950c;
              }
              if (uVar14 < 1000) {
                __len = __len - 1;
                goto LAB_0011950c;
              }
              if (uVar14 < 10000) goto LAB_0011950c;
              uVar19 = uVar19 / 10000;
              uVar7 = __len + 4;
            } while (99999 < uVar14);
            __len = __len + 1;
          }
LAB_0011950c:
          local_400 = local_3f0;
          std::__cxx11::string::_M_construct
                    ((ulong)&local_400,(char)__len - (char)((int)uVar22 >> 0x1f));
          std::__detail::__to_chars_10_impl<unsigned_int>
                    ((char *)((ulong)(uVar22 >> 0x1f) + (long)local_400),__len,uVar21);
          uVar19 = 0xf;
          if (local_3e0 != local_3d0) {
            uVar19 = local_3d0[0];
          }
          if (uVar19 < (ulong)(local_3f8 + local_3d8)) {
            uVar19 = 0xf;
            if (local_400 != local_3f0) {
              uVar19 = local_3f0[0];
            }
            if (uVar19 < (ulong)(local_3f8 + local_3d8)) goto LAB_00119599;
            puVar12 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)&local_400,0,(char *)0x0,(ulong)local_3e0);
          }
          else {
LAB_00119599:
            puVar12 = (undefined8 *)
                      std::__cxx11::string::_M_append((char *)&local_3e0,(ulong)local_400);
          }
          local_440 = &local_430;
          puVar1 = puVar12 + 2;
          if ((undefined8 *)*puVar12 == puVar1) {
            local_430 = *puVar1;
            uStack_428 = puVar12[3];
          }
          else {
            local_430 = *puVar1;
            local_440 = (undefined8 *)*puVar12;
          }
          local_438 = puVar12[1];
          *puVar12 = puVar1;
          puVar12[1] = 0;
          *(undefined1 *)puVar1 = 0;
          plVar13 = (long *)std::__cxx11::string::append((char *)&local_440);
          plVar17 = plVar13 + 2;
          if ((long *)*plVar13 == plVar17) {
            local_3b0 = *plVar17;
            lStack_3a8 = plVar13[3];
            local_3c0 = &local_3b0;
          }
          else {
            local_3b0 = *plVar17;
            local_3c0 = (long *)*plVar13;
          }
          local_3b8 = plVar13[1];
          *plVar13 = (long)plVar17;
          plVar13[1] = 0;
          *(undefined1 *)(plVar13 + 2) = 0;
          plVar13 = (long *)std::__cxx11::string::_M_append
                                      ((char *)&local_3c0,(ulong)ctx.fileName._M_dataplus._M_p);
          plVar17 = plVar13 + 2;
          if ((long *)*plVar13 == plVar17) {
            local_410 = *plVar17;
            lStack_408 = plVar13[3];
            local_420 = &local_410;
          }
          else {
            local_410 = *plVar17;
            local_420 = (long *)*plVar13;
          }
          local_418 = plVar13[1];
          *plVar13 = (long)plVar17;
          plVar13[1] = 0;
          *(undefined1 *)(plVar13 + 2) = 0;
          plVar13 = (long *)std::__cxx11::string::append((char *)&local_420);
          pp_Var18 = (_Base_ptr *)(plVar13 + 2);
          if ((_Base_ptr *)*plVar13 == pp_Var18) {
            local_228 = *pp_Var18;
            p_Stack_220 = (_Base_ptr)plVar13[3];
            _tmp = &local_228;
          }
          else {
            local_228 = *pp_Var18;
            _tmp = (_Base_ptr *)*plVar13;
          }
          *plVar13 = (long)pp_Var18;
          plVar13[1] = 0;
          *(undefined1 *)(plVar13 + 2) = 0;
          CompilationContext::globalError((char *)_tmp);
          if (_tmp != &local_228) {
            operator_delete(_tmp);
          }
          if (local_420 != &local_410) {
            operator_delete(local_420);
          }
          if (local_3c0 != &local_3b0) {
            operator_delete(local_3c0);
          }
          if (local_440 != &local_430) {
            operator_delete(local_440);
          }
          if (local_400 != local_3f0) {
            operator_delete(local_400);
          }
          if (local_3e0 != local_3d0) {
            operator_delete(local_3e0);
          }
          uVar21 = 1;
        }
      }
      else {
        if (!bVar8) goto LAB_001191b0;
LAB_00119221:
        node = sq3_parse(&lex);
        if (bVar6) {
          bVar9 = ast_to_json(local_498,node);
          bVar9 = bVar9 && ctx.isError == false;
        }
        else {
          bVar9 = true;
        }
        if ((ctx.isError & 1U) != 0) goto LAB_001193f3;
        if (!collect_ident_tree) {
          Analyzer::Analyzer((Analyzer *)&tmp,&lex);
          if (node != (Node *)0x0) {
            collect_ever_declared(&lex);
            Analyzer::collectGlobalTables((Analyzer *)&tmp,node);
            Analyzer::check((Analyzer *)&tmp,node);
            Analyzer::checkVariables
                      ((Analyzer *)&tmp,node,0,0x3fffffff,false,false,false,false,1,false);
          }
          Analyzer::~Analyzer((Analyzer *)&tmp);
          goto LAB_001193f3;
        }
        if (node == (Node *)0x0) goto LAB_001193f3;
        collect_ever_declared(&lex);
        uVar21 = 0;
        global_collect_tree(node,&ident_root);
      }
LAB_001197b1:
      if (lex.tokens.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(lex.tokens.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>_>_>
      ::~_Rb_tree(&lex.tokenIdentStringToType._M_t);
    }
  }
LAB_001197d0:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sqconfigFileName._M_dataplus._M_p != &sqconfigFileName.field_2) {
    operator_delete(sqconfigFileName._M_dataplus._M_p);
  }
LAB_001197e3:
  CompilationContext::~CompilationContext(&ctx);
  return uVar21;
}

Assistant:

int process_single_source(const string & file_name, const string & source_code, const string & sqconfig_file_name,
  bool use_csq, bool collect_ident_tree)
{
  CompilationContext ctx;

  if (collect_ident_tree)
    use_csq = false;

  bool inverseWarnings = false;
  bool printAst = false;

  bool printTokensToJson = false;
  bool printAstToJson = false;
  const char * tokensFileName = "";
  const char * astFileName = "";

  for (int i = 1; i < argc__; i++)
  {
    const char * arg = argv__[i];
    bool used = true;

    {
      // HACK: fix "duplucate-if-expression" -> "duplicate-if-expression", and support old config files
      if (!strcmp("-duplucate-if-expression", arg))
        arg = "-duplicate-if-expression";
    }

    if (!strncmp(arg, "--tokens-output-file:", 21))
    {
      printTokensToJson = true;
      tokensFileName = arg + 21;
    }
    else if (!strncmp(arg, "--ast-output-file:", 18))
    {
      printAstToJson = true;
      astFileName = arg + 18;
    }
    else if (!strcmp(arg, "--inverse-warnings"))
      inverseWarnings = true;
    else if (!strncmp(arg, "--csq-exe:", 10))
      moduleexports::csq_exe = arg + 10;
//    else if (!strcmp(arg, "--print-ast"))  // deprecated
//      printAst = true;
    else if (!strncmp(arg, "--output-mode:", 14))
      ctx.outputMode = str_to_output_mode(arg + 14);
    else if (arg[0] == '-' && (toupper(arg[1]) == 'W') && isdigit(arg[2]))
      ctx.suppressWaring(atoi(arg + 2));
    else if (arg[0] == '-' && isalpha(arg[1]))
      ctx.suppressWaring(arg + 1);
    else
      used = false;

    if (used)
      used_args.insert(i);
  }

  if (inverseWarnings)
    ctx.inverseWarningsSuppression();

  variable_presense_check = (!ctx.isWarningSuppressed("undefined-variable") ||
    !ctx.isWarningSuppressed("never-declared")) && use_csq;

  int expectWarningNumber = 0;
  bool expectError = false;


  if (file_name.empty())
  {
    CompilationContext::globalError("Expected file name");
    return 1;
  }

  if (source_code.empty())
  {
    ifstream tmp(file_name);
    if (tmp.fail())
    {
      CompilationContext::globalError((string("Cannot open file '") + file_name.c_str() + "'").c_str());
      return 1;
    }
    ctx.code = string((std::istreambuf_iterator<char>(tmp)), std::istreambuf_iterator<char>());
  }
  else
  {
    ctx.code = source_code;
  }

  ctx.setFileName(file_name);


  string sqconfigFileName = sqconfig_file_name.empty() ? settings::search_sqconfig(file_name.c_str()) : sqconfig_file_name;
  if (sqconfigFileName != settings::cur_config_file_name)
  {
    settings::reset();
    if (!sqconfigFileName.empty())
      if (!settings::append_from_file(sqconfigFileName.c_str()))
        return 1;
  }
  else if (settings::cur_config_file_failed)
  {
    return 1;
  }


  if (variable_presense_check)
    moduleexports::module_export_collector(ctx, 0, 0, nullptr);


  if (!strncmp(ctx.code.c_str(), "//expect:error", sizeof("//expect:error") - 1))
    expectError = true;

  if (!strncmp(ctx.code.c_str(), "//expect:w", sizeof("//expect:w") - 1))
    expectWarningNumber = atoi(ctx.code.c_str() + sizeof("//expect:w") - 1);

  if (expectError || expectWarningNumber)
    ctx.clearSuppressedWarnings();

  if ((printTokensToJson || printAstToJson) && !CompilationContext::redirectMessagesToJson)
  {
    ctx.clearSuppressedWarnings();
    ctx.inverseWarningsSuppression();
  }

  if (!process_import(ctx))
    return 1;

  Lexer lex(ctx);

  bool res = true;
  res = res && lex.process();

  if (printTokensToJson)
    res &= tokens_to_json(tokensFileName, lex);


  if (res)
  {
    Node * root = sq3_parse(lex); // do not delete, will be destroyed in ~CompilationContext()

    if (printAstToJson)
    {
      res &= ast_to_json(astFileName, root);
      res &= !ctx.isError;
    }

    if (root && printAst)
      root->print();


    if (!ctx.isError)
    {
      if (collect_ident_tree)
      {
        if (root)
        {
          collect_ever_declared(lex);
          global_collect_tree(root, &ident_root);
          return 0;
        }
      }
      else
      {
        Analyzer analyzer(lex);

        if (root)
        {
          collect_ever_declared(lex);
          analyzer.collectGlobalTables(root);
          analyzer.check(root);
          analyzer.checkVariables(root, 0, INT_MAX / 2, false, false, false, false, 1, false);
        }
      }
    }
  }

  if (ctx.isError || ctx.isWarning)
    res = false;

  if (expectError && !ctx.isError)
  {
    CompilationContext::globalError("Expected error.");
    return 1;
  }

  if (expectWarningNumber && (!ctx.isWarning || ctx.shownWarningsAndErrors.size() != 1 ||
    ctx.shownWarningsAndErrors[0] != expectWarningNumber))
  {
    CompilationContext::globalError((string("Expected only one warning 'w") +
      to_string(expectWarningNumber) + "' in file '" + ctx.fileName + "'").c_str());
    return 1;
  }

  if (expectError || expectWarningNumber)
  {
    if (CompilationContext::getErrorLevel() != ERRORLEVEL_FATAL)
      CompilationContext::clearErrorLevel();

    return 0;
  }

  return res ? 0 : 1;
}